

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_uv_area_report(REF_GRID ref_grid)

{
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint uVar7;
  int cell;
  uint id;
  char *pcVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL RVar12;
  uint local_e8;
  uint local_e4;
  double local_d0;
  REF_DBL sign_uv_area;
  REF_DBL uv_area;
  REF_INT nodes [27];
  
  ref_geom = ref_grid->geom;
  uVar4 = 0;
  uVar5 = (ulong)(uint)ref_geom->max;
  if (ref_geom->max < 1) {
    uVar5 = uVar4;
  }
  ref_cell = ref_grid->cell[3];
  uVar7 = 0x80000000;
  id = 0x7fffffff;
  for (; uVar5 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    if (*(int *)((long)ref_geom->descr + uVar4) == 2) {
      uVar3 = *(uint *)((long)ref_geom->descr + uVar4 + 4);
      if ((int)uVar3 <= (int)id) {
        id = uVar3;
      }
      if ((int)uVar7 <= (int)uVar3) {
        uVar7 = uVar3;
      }
    }
  }
  do {
    if ((int)uVar7 < (int)id) {
      return 0;
    }
    dVar9 = 0.0;
    local_d0 = 0.0;
    bVar1 = true;
    dVar11 = 0.0;
    local_e4 = 0;
    local_e8 = 0;
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar2 = ref_cell_nodes(ref_cell,cell,nodes);
      if ((RVar2 == 0) && (id == nodes[3])) {
        uVar3 = ref_geom_uv_area(ref_geom,nodes,&uv_area);
        if (uVar3 != 0) {
          pcVar8 = "uv area";
          uVar6 = 0x14b;
          goto LAB_0013ef9a;
        }
        dVar10 = uv_area;
        RVar12 = uv_area;
        if (!bVar1) {
          dVar10 = dVar9;
          if (uv_area <= dVar9) {
            dVar10 = uv_area;
          }
          RVar12 = dVar11;
          if (dVar11 <= uv_area) {
            RVar12 = uv_area;
          }
        }
        local_d0 = local_d0 + uv_area;
        if (0.0 <= uv_area) {
          local_e8 = local_e8 + 1;
        }
        else {
          local_e4 = local_e4 + 1;
        }
        bVar1 = false;
        dVar9 = dVar10;
        dVar11 = RVar12;
      }
    }
    if (!bVar1) {
      uVar3 = ref_geom_uv_area_sign(ref_grid,id,&sign_uv_area);
      if (uVar3 != 0) {
        pcVar8 = "sign";
        uVar6 = 0x15d;
LAB_0013ef9a:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar6,"ref_geom_uv_area_report",(ulong)uVar3,pcVar8);
        return uVar3;
      }
      printf("face%5d: %4.1f %9.2e total (%10.3e,%10.3e) %d + %d -\n",sign_uv_area,local_d0,dVar9,
             dVar11,(ulong)id,(ulong)local_e8,(ulong)local_e4);
    }
    id = id + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_report(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT geom, id, min_id, max_id;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL no_cell;
  REF_DBL uv_area, total_uv_area, min_uv_area, max_uv_area, sign_uv_area;
  REF_INT n_neg, n_pos;

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++) {
    no_cell = REF_TRUE;
    total_uv_area = 0.0;
    min_uv_area = 0.0;
    max_uv_area = 0.0;
    n_neg = 0;
    n_pos = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id == nodes[3]) {
        RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
        total_uv_area += uv_area;
        if (no_cell) {
          min_uv_area = uv_area;
          max_uv_area = uv_area;
          no_cell = REF_FALSE;
        } else {
          min_uv_area = MIN(min_uv_area, uv_area);
          max_uv_area = MAX(max_uv_area, uv_area);
        }
        if (uv_area < 0.0) {
          n_neg++;
        } else {
          n_pos++;
        }
      }
    }
    if (!no_cell) {
      RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
      printf("face%5d: %4.1f %9.2e total (%10.3e,%10.3e) %d + %d -\n", id,
             sign_uv_area, total_uv_area, min_uv_area, max_uv_area, n_pos,
             n_neg);
    }
  }

  return REF_SUCCESS;
}